

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::~QArrayDataPointer
          (QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *this)

{
  Data *pDVar1;
  long lVar2;
  QDnsCachedName *pQVar3;
  int *piVar4;
  long lVar5;
  
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      lVar2 = this->size;
      if (lVar2 != 0) {
        pQVar3 = this->ptr;
        lVar5 = 0;
        do {
          piVar4 = *(int **)((long)&(pQVar3->name).d.d + lVar5);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              QArrayData::deallocate(*(QArrayData **)((long)&(pQVar3->name).d.d + lVar5),2,0x10);
            }
          }
          lVar5 = lVar5 + 0x20;
        } while (lVar2 << 5 != lVar5);
      }
      QArrayData::deallocate(&this->d->super_QArrayData,0x20,0x10);
      return;
    }
  }
  return;
}

Assistant:

~QArrayDataPointer()
    {
        if (!deref()) {
            (*this)->destroyAll();
            Data::deallocate(d);
        }
    }